

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.cpp
# Opt level: O2

void __thiscall
duckdb::OutOfRangeException::OutOfRangeException
          (OutOfRangeException *this,double value,PhysicalType orig_type,PhysicalType new_type)

{
  PhysicalType type;
  undefined7 in_register_00000031;
  string local_118;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  TypeIdToString_abi_cxx11_(&local_38,(duckdb *)CONCAT71(in_register_00000031,orig_type),new_type);
  ::std::operator+(&local_d8,"Type ",&local_38);
  ::std::operator+(&local_b8,&local_d8," with value ");
  std::__cxx11::to_string(&local_f8,value);
  ::std::operator+(&local_98,&local_b8,&local_f8);
  ::std::operator+(&local_78,&local_98,
                   " can\'t be cast because the value is out of range for the destination type ");
  TypeIdToString_abi_cxx11_(&local_118,(duckdb *)(ulong)new_type,type);
  ::std::operator+(&local_58,&local_78,&local_118);
  Exception::Exception(&this->super_Exception,OUT_OF_RANGE,&local_58);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_118);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::__cxx11::string::~string((string *)&local_98);
  ::std::__cxx11::string::~string((string *)&local_f8);
  ::std::__cxx11::string::~string((string *)&local_b8);
  ::std::__cxx11::string::~string((string *)&local_d8);
  ::std::__cxx11::string::~string((string *)&local_38);
  *(undefined ***)&this->super_Exception = &PTR__runtime_error_02795750;
  return;
}

Assistant:

OutOfRangeException::OutOfRangeException(const double value, const PhysicalType orig_type, const PhysicalType new_type)
    : Exception(ExceptionType::OUT_OF_RANGE, "Type " + TypeIdToString(orig_type) + " with value " + to_string(value) +
                                                 " can't be cast because the value is out of range "
                                                 "for the destination type " +
                                                 TypeIdToString(new_type)) {
}